

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O2

UChar32 utext_previous32_63(UText *ut)

{
  UChar UVar1;
  UBool UVar2;
  int iVar3;
  long lVar4;
  UChar *pUVar5;
  int iVar6;
  uint uVar7;
  
  iVar6 = ut->chunkOffset;
  if (iVar6 < 1) {
    UVar2 = (*ut->pFuncs->access)(ut,ut->chunkNativeStart,'\0');
    if (UVar2 == '\0') {
      return -1;
    }
    iVar6 = ut->chunkOffset;
  }
  iVar3 = iVar6 + -1;
  ut->chunkOffset = iVar3;
  pUVar5 = ut->chunkContents;
  UVar1 = pUVar5[(long)iVar6 + -1];
  uVar7 = (uint)(ushort)UVar1;
  if ((UVar1 & 0xfc00U) == 0xdc00) {
    if (iVar6 < 2) {
      UVar2 = (*ut->pFuncs->access)(ut,ut->chunkNativeStart,'\0');
      if (UVar2 == '\0') {
        return (uint)(ushort)UVar1;
      }
      pUVar5 = ut->chunkContents;
      iVar3 = ut->chunkOffset;
      lVar4 = (long)iVar3;
    }
    else {
      lVar4 = (long)iVar6 + -1;
    }
    uVar7 = (uint)(ushort)UVar1;
    if ((pUVar5[lVar4 + -1] & 0xfc00U) == 0xd800) {
      uVar7 = (uint)(ushort)UVar1 + (uint)(ushort)pUVar5[lVar4 + -1] * 0x400 + 0xfca02400;
      ut->chunkOffset = iVar3 + -1;
    }
  }
  return uVar7;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
utext_previous32(UText *ut) {
    UChar32       c;

    if (ut->chunkOffset <= 0) {
        if (ut->pFuncs->access(ut, ut->chunkNativeStart, FALSE) == FALSE) {
            return U_SENTINEL;
        }
    }
    ut->chunkOffset--;
    c = ut->chunkContents[ut->chunkOffset];
    if (U16_IS_TRAIL(c) == FALSE) {
        // Normal case, not supplementary.
        //   (A lead surrogate seen here is just returned as is, as a surrogate value.
        //    It cannot be part of a pair.)
        return c;
    }

    if (ut->chunkOffset <= 0) {
        if (ut->pFuncs->access(ut, ut->chunkNativeStart, FALSE) == FALSE) {
            // c is an unpaired trail surrogate at the start of the text.
            // return it as it is.
            return c;
        }
    }

    UChar32 lead = ut->chunkContents[ut->chunkOffset-1];
    if (U16_IS_LEAD(lead) == FALSE) {
        // c was an unpaired trail surrogate, not at the end of the text.
        // return it as it is (unpaired).  Iteration position is at c
        return c;
    }

    UChar32 supplementary = U16_GET_SUPPLEMENTARY(lead, c);
    ut->chunkOffset--;   // move iteration position over the lead surrogate.
    return supplementary;
}